

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

void vkt::addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
               (TestCaseGroup *group,string *name,string *desc,Function initPrograms,
               Function testFunc,InstanceContext *arg0)

{
  TestContext *testCtx;
  TestNode *node;
  InstanceContext local_110;
  
  testCtx = (group->super_TestNode).m_testCtx;
  SpirVAssembly::InstanceContext::InstanceContext(&local_110,arg0);
  node = (TestNode *)
         createFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                   (testCtx,NODETYPE_SELF_VALIDATE,name,desc,initPrograms,testFunc,&local_110);
  tcu::TestNode::addChild(&group->super_TestNode,node);
  SpirVAssembly::InstanceContext::~InstanceContext(&local_110);
  return;
}

Assistant:

void addFunctionCaseWithPrograms (tcu::TestCaseGroup*							group,
								  const std::string&							name,
								  const std::string&							desc,
								  typename FunctionPrograms1<Arg0>::Function	initPrograms,
								  typename FunctionInstance1<Arg0>::Function	testFunc,
								  Arg0											arg0)
{
	group->addChild(createFunctionCaseWithPrograms<Arg0>(group->getTestContext(), tcu::NODETYPE_SELF_VALIDATE, name, desc, initPrograms, testFunc, arg0));
}